

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O3

void conn_get_remote_addr(conn_handle *conn,char *dest)

{
  char *pcVar1;
  void *pvVar2;
  size_t sVar3;
  char *result;
  
  pvVar2 = conn->priv;
  if (*(short *)((long)pvVar2 + 0x10) == 10) {
    *dest = '[';
    inet_ntop((uint)*(ushort *)((long)pvVar2 + 0x10),(void *)((long)pvVar2 + 0x18),dest + 1,0x2e);
    sVar3 = strlen(dest);
    pcVar1 = dest + sVar3;
    result = pcVar1 + 2;
    pcVar1[0] = ']';
    pcVar1[1] = ':';
  }
  else {
    if (*(short *)((long)pvVar2 + 0x10) != 2) {
      builtin_strncpy(dest,"(unknown)",10);
      return;
    }
    inet_ntop(2,(void *)((long)pvVar2 + 0x14),dest,0x2e);
    sVar3 = strlen(dest);
    result = dest + sVar3 + 1;
    dest[sVar3] = ':';
  }
  conn_port_to_str(*(uint16_t *)((long)pvVar2 + 0x12),result);
  return;
}

Assistant:

void conn_get_remote_addr(const struct conn_handle *conn, char dest[54])
{
	const struct conn_priv *priv = conn->priv;
	const struct sockaddr_in *addr = (const struct sockaddr_in *)&priv->remote_addr;
	const struct sockaddr_in6 *addr6 = (const struct sockaddr_in6 *)&priv->remote_addr;

	switch (priv->remote_addr.ss_family) {
	case AF_INET:
		inet_ntop(addr->sin_family, &addr->sin_addr.s_addr, dest, 46);
		dest += strlen(dest);
		dest[0] = ':';
		conn_port_to_str(addr->sin_port, dest + 1);
		break;
	case AF_INET6:
		dest[0] = '[';
		inet_ntop(addr6->sin6_family, &addr6->sin6_addr.s6_addr,
			  dest + 1, 46);
		dest += strlen(dest);
		dest[0] = ']';
		dest[1] = ':';
		conn_port_to_str(addr6->sin6_port, dest + 2);
		break;
	default:
		strcpy(dest, "(unknown)");
		break;
	}
}